

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.cpp
# Opt level: O2

TonkResult
tonk_connect(TonkSocket tonkSocket,TonkConnectionConfig config,char *hostname,uint16_t port,
            TonkConnection *connectionOut,TonkJson *errorJsonOut)

{
  TonkResult TVar1;
  
  if (fp_tonk_connect != (fp_tonk_connect_t)0x0) {
    TVar1 = (*fp_tonk_connect)(tonkSocket,config,hostname,port,connectionOut,errorJsonOut);
    return TVar1;
  }
  if (connectionOut != (TonkConnection *)0x0) {
    *connectionOut = (TonkConnection)0x0;
  }
  if (errorJsonOut != (TonkJson *)0x0) {
    memset(errorJsonOut,0,0x400);
  }
  return Tonk_DLL_Not_Found;
}

Assistant:

TonkResult tonk_connect(
    TonkSocket          tonkSocket, // Socket to connect from
    TonkConnectionConfig    config, // Configuration for the connection
    const char*           hostname, // Hostname of the remote host
    uint16_t                  port, // Port for the remote host
    TonkConnection*  connectionOut, // Set to connection on success, else 0
    TonkJson*         errorJsonOut  // Receives detailed error message on error
)
{
    if (!fp_tonk_connect)
    {
        if (connectionOut) {
            *connectionOut = nullptr;
        }
        if (errorJsonOut) {
            *errorJsonOut = TonkJson();
        }
        return Tonk_DLL_Not_Found;
    }

    return fp_tonk_connect(
        tonkSocket,
        config,
        hostname,
        port,
        connectionOut,
        errorJsonOut);
}